

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_log__do_write_end
              (st_ptls_log_point_t *point,st_ptls_log_conn_state_t *conn,
              _func_char_ptr_void_ptr *get_sni,void *get_sni_arg,int includes_appdata)

{
  undefined1 *puVar1;
  anon_struct_40_6_a046b94a *paVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long *in_FS_OFFSET;
  bool bVar9;
  
  iVar8 = 0;
  iVar3 = expand_logbuf_or_invalidate("}\n",2,0);
  if (iVar3 != 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
    if ((point->state).generation != ptls_log._generation) {
      ptls_log__recalc_point(1,point);
    }
    uVar6 = (point->state).active_conns;
    if ((conn != (st_ptls_log_conn_state_t *)0x0) &&
       ((conn->state).generation != ptls_log._generation)) {
      ptls_log__recalc_conn(1,conn,get_sni,get_sni_arg);
      uVar6 = uVar6 & (conn->state).active_conns;
    }
    if (uVar6 == 0) {
      iVar8 = 0;
    }
    else {
      lVar7 = 0;
      iVar8 = 0;
      do {
        if ((uVar6 & 1) != 0) {
          if (logctx.conns[lVar7].points == (char *)0x0) {
            __assert_fail("logctx.conns[slot].points != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                          ,0x1bc6,
                          "int ptls_log__do_write_end(struct st_ptls_log_point_t *, struct st_ptls_log_conn_state_t *, const char *(*)(void *), void *, int)"
                         );
          }
          paVar2 = logctx.conns + lVar7;
          if (((byte)logctx.conns[lVar7].field_0x24 & 1) == includes_appdata) {
            do {
              sVar4 = write(paVar2->fd,(void *)in_FS_OFFSET[-0x19],in_FS_OFFSET[-0x17]);
              if (sVar4 != -1) {
                if (sVar4 == in_FS_OFFSET[-0x17]) goto LAB_0010f909;
                if (sVar4 < 1) goto LAB_0010f873;
                goto LAB_0010f902;
              }
              piVar5 = __errno_location();
            } while (*piVar5 == 4);
            if (in_FS_OFFSET[-0x17] != -1) {
              if (*piVar5 == 0xb) {
LAB_0010f902:
                logctx.num_lost = logctx.num_lost + 1;
              }
              else {
LAB_0010f873:
                if ((paVar2->fd < 0) || (logctx.conns[lVar7].points == (char *)0x0)) {
                  __assert_fail("logctx.conns[slot].fd >= 0 && logctx.conns[slot].points != NULL",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                ,0x1abc,"void close_log_fd(size_t)");
                }
                close(paVar2->fd);
                paVar2->fd = -1;
                logctx.conns[lVar7].sample_ratio = 0.0;
                free(logctx.conns[lVar7].points);
                logctx.conns[lVar7].points = (char *)0x0;
                free(logctx.conns[lVar7].snis);
                logctx.conns[lVar7].snis = (char *)0x0;
                free(logctx.conns[lVar7].addresses);
                logctx.conns[lVar7].addresses = (in6_addr *)0x0;
                puVar1 = &logctx.conns[lVar7].field_0x24;
                *puVar1 = *puVar1 & 0xfe;
                ptls_log._generation = ptls_log._generation + 1;
              }
            }
          }
          else if ((includes_appdata == 0) && ((ptls_log._0_1_ & 1) != 0)) {
            iVar8 = 1;
          }
        }
LAB_0010f909:
        lVar7 = lVar7 + 1;
        bVar9 = 1 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar9);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
    if ((includes_appdata != 0) && (iVar8 != 0)) {
      __assert_fail("!needs_appdata",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x1be0,
                    "int ptls_log__do_write_end(struct st_ptls_log_point_t *, struct st_ptls_log_conn_state_t *, const char *(*)(void *), void *, int)"
                   );
    }
    ptls_buffer__release_memory((ptls_buffer_t *)(*in_FS_OFFSET + -200));
    in_FS_OFFSET[-0x17] = 0;
    in_FS_OFFSET[-0x16] = 0;
    in_FS_OFFSET[-0x19] = 0;
    in_FS_OFFSET[-0x18] = 0;
  }
  return iVar8;
}

Assistant:

int ptls_log__do_write_end(struct st_ptls_log_point_t *point, struct st_ptls_log_conn_state_t *conn, const char *(*get_sni)(void *),
                           void *get_sni_arg, int includes_appdata)
{
    if (!expand_logbuf_or_invalidate("}\n", 2, 0))
        return 0;

    int needs_appdata = 0;

    pthread_mutex_lock(&logctx.mutex);

    /* calc the active conn bits, updating stale information if necessary */
    if (point->state.generation != ptls_log._generation)
        ptls_log__recalc_point(1, point);
    uint32_t active = point->state.active_conns;
    if (conn != NULL && conn->state.generation != ptls_log._generation) {
        ptls_log__recalc_conn(1, conn, get_sni, get_sni_arg);
        active &= conn->state.active_conns;
    }

    /* iterate through the active connctions */
    for (size_t slot = 0; active != 0; ++slot, active >>= 1) {
        if ((active & 1) == 0)
            continue;

        assert(logctx.conns[slot].points != NULL);

        if (logctx.conns[slot].appdata != includes_appdata) {
            if (!includes_appdata && ptls_log.may_include_appdata)
                needs_appdata = 1;
            continue;
        }

        /* write */
        ssize_t wret;
        while ((wret = write(logctx.conns[slot].fd, logbuf.buf.base, logbuf.buf.off)) == -1 && errno == EINTR)
            ;
        if (wret == logbuf.buf.off) {
            /* success */
        } else if (wret > 0 || (wret == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))) {
            /* partial write or buffer full */
            ++logctx.num_lost;
        } else {
            /* write error; close and unregister the connection */
            close_log_fd(slot);
        }
    }

    pthread_mutex_unlock(&logctx.mutex);

    if (includes_appdata)
        assert(!needs_appdata);

    ptls_buffer_dispose(&logbuf.buf);
    assert(logbuf.buf.base == NULL);
    return needs_appdata;
}